

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitOrOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  AggregateFinalizeData *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  hugeint_t *rdata_1;
  BitState<duckdb::hugeint_t> **sdata_1;
  AggregateFinalizeData finalize_data;
  hugeint_t *rdata;
  BitState<duckdb::hugeint_t> **sdata;
  AggregateFinalizeData *in_stack_ffffffffffffff80;
  AggregateFinalizeData *finalize_data_00;
  Vector *in_stack_ffffffffffffff88;
  AggregateInputData *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  VectorType vector_type_p;
  Vector *in_stack_ffffffffffffffb0;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    ConstantVector::GetData<duckdb::BitState<duckdb::hugeint_t>*>((Vector *)0x1c810c0);
    ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x1c810cf);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb0,in_RDX,in_RSI);
    BitwiseOperation::Finalize<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>>
              ((BitState<duckdb::hugeint_t> *)in_stack_ffffffffffffff90,
               (hugeint_t *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  else {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    FlatVector::GetData<duckdb::BitState<duckdb::hugeint_t>*>((Vector *)0x1c8111d);
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x1c8112c);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffff88,in_RDX,in_RSI);
    for (finalize_data_00 = (AggregateFinalizeData *)0x0; finalize_data_00 < in_RCX;
        finalize_data_00 = (AggregateFinalizeData *)((long)&finalize_data_00->result + 1)) {
      BitwiseOperation::Finalize<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>>
                ((BitState<duckdb::hugeint_t> *)in_stack_ffffffffffffff90,
                 (hugeint_t *)in_stack_ffffffffffffff88,finalize_data_00);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}